

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodes_Declarations.h
# Opt level: O0

void __thiscall
psy::C::AbstractDeclaratorSyntax::~AbstractDeclaratorSyntax(AbstractDeclaratorSyntax *this)

{
  void *in_RSI;
  AbstractDeclaratorSyntax *this_local;
  
  ~AbstractDeclaratorSyntax(this);
  Managed::operator_delete((Managed *)this,in_RSI);
  return;
}

Assistant:

class PSY_C_API AbstractDeclaratorSyntax final : public DeclaratorSyntax
{
    AST_NODE_1K(AbstractDeclarator, Declarator)

public:
    const SpecifierListSyntax* attributes() const { return attrs_; }

private:
    SpecifierListSyntax* attrs_ = nullptr;
    AST_CHILD_LST1(attrs_);
}